

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cmds.cpp
# Opt level: O0

void Cmd_special(FCommandLine *argv,APlayerPawn *who,int key)

{
  int it;
  char *pcVar1;
  char *pcVar2;
  int local_2c;
  uint local_28;
  int i;
  int min_args;
  int specnum;
  int argc;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  specnum = key;
  _argc = who;
  who_local = (APlayerPawn *)argv;
  min_args = FCommandLine::argc(argv);
  if ((min_args < 2) || (7 < min_args)) {
    Printf("Usage: special <special-name> [arg1] [arg2] [arg3] [arg4] [arg5]\n");
    return;
  }
  pcVar1 = FCommandLine::operator[]((FCommandLine *)who_local,1);
  if ((*pcVar1 < '0') ||
     (pcVar1 = FCommandLine::operator[]((FCommandLine *)who_local,1), '9' < *pcVar1)) {
    pcVar1 = FCommandLine::operator[]((FCommandLine *)who_local,1);
    i = P_FindLineSpecial(pcVar1,(int *)&local_28,(int *)0x0);
    if ((i == 0) || ((int)local_28 < 0)) {
      Printf("Unknown special\n");
      return;
    }
    if (min_args < (int)(local_28 + 2)) {
      pcVar1 = FCommandLine::operator[]((FCommandLine *)who_local,1);
      pcVar2 = "s";
      if (local_28 == 1) {
        pcVar2 = "";
      }
      Printf("%s needs at least %d argument%s\n",pcVar1,(ulong)local_28,pcVar2);
      return;
    }
  }
  else {
    pcVar1 = FCommandLine::operator[]((FCommandLine *)who_local,1);
    i = atoi(pcVar1);
    if ((i < 0) || (0xff < i)) {
      Printf("Bad special number\n");
      return;
    }
  }
  Net_WriteByte('>');
  Net_WriteWord((short)i);
  Net_WriteByte((char)min_args + 0xfe);
  for (local_2c = 2; local_2c < min_args; local_2c = local_2c + 1) {
    pcVar1 = FCommandLine::operator[]((FCommandLine *)who_local,local_2c);
    it = atoi(pcVar1);
    Net_WriteLong(it);
  }
  return;
}

Assistant:

CCMD (special)
{
	int argc = argv.argc();

	if (argc < 2 || argc > 7)
	{
		Printf("Usage: special <special-name> [arg1] [arg2] [arg3] [arg4] [arg5]\n");
	}
	else
	{
		int specnum;

		if (argv[1][0] >= '0' && argv[1][0] <= '9')
		{
			specnum = atoi(argv[1]);
			if (specnum < 0 || specnum > 255)
			{
				Printf("Bad special number\n");
				return;
			}
		}
		else
		{
			int min_args;
			specnum = P_FindLineSpecial(argv[1], &min_args);
			if (specnum == 0 || min_args < 0)
			{
				Printf("Unknown special\n");
				return;
			}
			if (argc < 2 + min_args)
			{
				Printf("%s needs at least %d argument%s\n", argv[1], min_args, min_args == 1 ? "" : "s");
				return;
			}
		}
		Net_WriteByte(DEM_RUNSPECIAL);
		Net_WriteWord(specnum);
		Net_WriteByte(argc - 2);
		for (int i = 2; i < argc; ++i)
		{
			Net_WriteLong(atoi(argv[i]));
		}
	}
}